

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_ehlo_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  size_t sStack_50;
  uint mechbit;
  size_t llen;
  size_t wordlen;
  size_t len;
  char *line;
  smtp_conn *smtpc;
  SessionHandle *data;
  smtpstate local_18;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  smtpc = (smtp_conn *)conn->data;
  line = (char *)&conn->proto;
  len = (size_t)(((SessionHandle *)smtpc)->state).buffer;
  local_18 = instate;
  result = smtpcode;
  _instate_local = conn;
  wordlen = strlen((char *)len);
  if (((int)result / 100 == 2) || (result == CURLE_UNSUPPORTED_PROTOCOL)) {
    len = len + 4;
    wordlen = wordlen - 4;
    if ((wordlen < 8) || (*(long *)len != 0x534c545452415453)) {
      if ((wordlen < 4) || (*(int *)len != 0x455a4953)) {
        if ((4 < wordlen) && (iVar1 = memcmp((void *)len,"AUTH ",5), iVar1 == 0)) {
          line[0xa2] = '\x01';
          len = len + 5;
          wordlen = wordlen - 5;
          while( true ) {
            while( true ) {
              bVar3 = false;
              if ((((wordlen != 0) && (bVar3 = true, *(char *)len != ' ')) &&
                  (bVar3 = true, *(char *)len != '\t')) && (bVar3 = true, *(char *)len != '\r')) {
                bVar3 = *(char *)len == '\n';
              }
              if (!bVar3) break;
              len = len + 1;
              wordlen = wordlen - 1;
            }
            if (wordlen == 0) break;
            llen = 0;
            while( true ) {
              bVar3 = false;
              if (((llen < wordlen) && (bVar3 = false, *(char *)(len + llen) != ' ')) &&
                 ((bVar3 = false, *(char *)(len + llen) != '\t' &&
                  (bVar3 = false, *(char *)(len + llen) != '\r')))) {
                bVar3 = *(char *)(len + llen) != '\n';
              }
              if (!bVar3) break;
              llen = llen + 1;
            }
            uVar2 = Curl_sasl_decode_mech((char *)len,llen,&stack0xffffffffffffffb0);
            if ((uVar2 != 0) && (sStack_50 == llen)) {
              *(uint *)(line + 0x8c) = uVar2 | *(uint *)(line + 0x8c);
            }
            len = llen + len;
            wordlen = wordlen - llen;
          }
        }
      }
      else {
        line[0xa1] = '\x01';
      }
    }
    else {
      line[0xa0] = '\x01';
    }
    if (result != CURLE_UNSUPPORTED_PROTOCOL) {
      if (((int)smtpc[7].pp.cache_size == 0) || ((_instate_local->ssl[0].use & 1U) != 0)) {
        data._4_4_ = smtp_perform_authentication(_instate_local);
      }
      else if ((line[0xa0] & 1U) == 0) {
        if ((int)smtpc[7].pp.cache_size == 1) {
          data._4_4_ = smtp_perform_authentication(_instate_local);
        }
        else {
          Curl_failf((SessionHandle *)smtpc,"STARTTLS not supported.");
          data._4_4_ = CURLE_USE_SSL_FAILED;
        }
      }
      else {
        data._4_4_ = smtp_perform_starttls(_instate_local);
      }
    }
  }
  else if (((uint)smtpc[7].pp.cache_size < 2) || ((_instate_local->ssl[0].use & 1U) != 0)) {
    data._4_4_ = smtp_perform_helo(_instate_local);
  }
  else {
    Curl_failf((SessionHandle *)smtpc,"Remote access denied: %d",(ulong)result);
    data._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_ehlo_resp(struct connectdata *conn, int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  const char *line = data->state.buffer;
  size_t len = strlen(line);
  size_t wordlen;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2 && smtpcode != 1) {
    if(data->set.use_ssl <= CURLUSESSL_TRY || conn->ssl[FIRSTSOCKET].use)
      result = smtp_perform_helo(conn);
    else {
      failf(data, "Remote access denied: %d", smtpcode);
      result = CURLE_REMOTE_ACCESS_DENIED;
    }
  }
  else {
    line += 4;
    len -= 4;

    /* Does the server support the STARTTLS capability? */
    if(len >= 8 && !memcmp(line, "STARTTLS", 8))
      smtpc->tls_supported = TRUE;

    /* Does the server support the SIZE capability? */
    else if(len >= 4 && !memcmp(line, "SIZE", 4))
      smtpc->size_supported = TRUE;

    /* Does the server support authentication? */
    else if(len >= 5 && !memcmp(line, "AUTH ", 5)) {
      smtpc->auth_supported = TRUE;

      /* Advance past the AUTH keyword */
      line += 5;
      len -= 5;

      /* Loop through the data line */
      for(;;) {
        size_t llen;
        unsigned int mechbit;

        while(len &&
              (*line == ' ' || *line == '\t' ||
               *line == '\r' || *line == '\n')) {

          line++;
          len--;
        }

        if(!len)
          break;

        /* Extract the word */
        for(wordlen = 0; wordlen < len && line[wordlen] != ' ' &&
              line[wordlen] != '\t' && line[wordlen] != '\r' &&
              line[wordlen] != '\n';)
          wordlen++;

        /* Test the word for a matching authentication mechanism */
        if((mechbit = Curl_sasl_decode_mech(line, wordlen, &llen)) &&
           llen == wordlen)
          smtpc->sasl.authmechs |= mechbit;

        line += wordlen;
        len -= wordlen;
      }
    }

    if(smtpcode != 1) {
      if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
        /* We don't have a SSL/TLS connection yet, but SSL is requested */
        if(smtpc->tls_supported)
          /* Switch to TLS connection now */
          result = smtp_perform_starttls(conn);
        else if(data->set.use_ssl == CURLUSESSL_TRY)
          /* Fallback and carry on with authentication */
          result = smtp_perform_authentication(conn);
        else {
          failf(data, "STARTTLS not supported.");
          result = CURLE_USE_SSL_FAILED;
        }
      }
      else
        result = smtp_perform_authentication(conn);
    }
  }

  return result;
}